

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O2

MMDB_entry_data_list_s * test_mapX_key_value_pair(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_s entry_data;
  MMDB_entry_data_s entry_data_00;
  int iVar1;
  char *__s1;
  char *pcVar2;
  MMDB_entry_data_list_s *entry_data_list_00;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 in_stack_ffffffffffffffd8;
  
  entry_data_list_00 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xa3,(entry_data_list_00->entry_data).type,"==",2,
                "found a map key in \'map{mapX}\'",0);
  uVar3 = *(undefined8 *)&entry_data_list_00->entry_data;
  uVar4 = *(undefined8 *)&(entry_data_list_00->entry_data).field_0x8;
  pcVar2 = (entry_data_list_00->entry_data).field_1.utf8_string;
  entry_data.field_1.uint128._8_8_ = in_stack_ffffffffffffffd8;
  entry_data._0_24_ = *(undefined1 (*) [24])((long)&(entry_data_list_00->entry_data).field_1 + 8);
  entry_data.offset = (int)unaff_RBX;
  entry_data.offset_to_next = (int)((ulong)unaff_RBX >> 0x20);
  entry_data.data_size = (int)unaff_R12;
  entry_data.type = (int)((ulong)unaff_R12 >> 0x20);
  __s1 = dup_entry_string_or_bail(entry_data);
  iVar1 = strcmp(__s1,"utf8_stringX");
  if (iVar1 == 0) {
    entry_data_list_00 = entry_data_list_00->next;
    cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                  ,0xac,(entry_data_list_00->entry_data).type,"==",2,
                  "\'map{mapX}{utf8_stringX}\' type is utf8_string",0,uVar4,pcVar2);
    entry_data_00.field_1.uint128._8_8_ = in_stack_ffffffffffffffd8;
    entry_data_00._0_24_ =
         *(undefined1 (*) [24])((long)&(entry_data_list_00->entry_data).field_1 + 8);
    entry_data_00.offset = (int)unaff_RBX;
    entry_data_00.offset_to_next = (int)((ulong)unaff_RBX >> 0x20);
    entry_data_00.data_size = (int)unaff_R12;
    entry_data_00.type = (int)((ulong)unaff_R12 >> 0x20);
    pcVar2 = dup_entry_string_or_bail(entry_data_00);
    iVar1 = strcmp(pcVar2,"hello");
    ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
              ,0xb0,(uint)(iVar1 == 0),"map{mapX}{utf8_stringX} value is \'hello\'",0);
    free(pcVar2);
  }
  else {
    iVar1 = strcmp(__s1,"arrayX");
    if (iVar1 == 0) {
      entry_data_list_00 = test_arrayX_value(entry_data_list_00);
    }
    else {
      ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xb5,0,"unknown key found in map{mapX} - %s",__s1,0,uVar3);
    }
  }
  free(__s1);
  return entry_data_list_00;
}

Assistant:

MMDB_entry_data_list_s *
test_mapX_key_value_pair(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *mapX_key = entry_data_list = entry_data_list->next;
    cmp_ok(mapX_key->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UTF8_STRING,
           "found a map key in 'map{mapX}'");
    char *mapX_key_name = dup_entry_string_or_bail(mapX_key->entry_data);

    if (strcmp(mapX_key_name, "utf8_stringX") == 0) {
        MMDB_entry_data_list_s *mapX_value = entry_data_list =
            entry_data_list->next;
        cmp_ok(mapX_value->entry_data.type,
               "==",
               MMDB_DATA_TYPE_UTF8_STRING,
               "'map{mapX}{utf8_stringX}' type is utf8_string");
        char *utf8_stringX_value =
            dup_entry_string_or_bail(mapX_value->entry_data);
        ok(strcmp(utf8_stringX_value, "hello") == 0,
           "map{mapX}{utf8_stringX} value is 'hello'");
        free(utf8_stringX_value);
    } else if (strcmp(mapX_key_name, "arrayX") == 0) {
        entry_data_list = test_arrayX_value(entry_data_list);
    } else {
        ok(0, "unknown key found in map{mapX} - %s", mapX_key_name);
    }

    free(mapX_key_name);

    return entry_data_list;
}